

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O2

char * dh_validate_f(dh_ctx *ctx,mp_int *f)

{
  uint uVar1;
  mp_int *r;
  char *pcVar2;
  
  uVar1 = mp_hs_integer(f,2);
  if (uVar1 == 0) {
    pcVar2 = "f value received is too small";
  }
  else {
    r = mp_copy(ctx->p);
    mp_sub_integer_into(r,r,1);
    uVar1 = mp_cmp_hs(f,r);
    mp_free(r);
    pcVar2 = (char *)0x0;
    if (uVar1 != 0) {
      pcVar2 = "f value received is too large";
    }
  }
  return pcVar2;
}

Assistant:

const char *dh_validate_f(dh_ctx *ctx, mp_int *f)
{
    if (!mp_hs_integer(f, 2)) {
        return "f value received is too small";
    } else {
        mp_int *pm1 = mp_copy(ctx->p);
        mp_sub_integer_into(pm1, pm1, 1);
        unsigned cmp = mp_cmp_hs(f, pm1);
        mp_free(pm1);
        if (cmp)
            return "f value received is too large";
    }
    return NULL;
}